

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuX11.cpp
# Opt level: O0

void __thiscall tcu::x11::XlibWindow::setDimensions(XlibWindow *this,int width,int height)

{
  Display *pDVar1;
  undefined1 local_168 [8];
  XConfigureEvent e;
  XEvent myevent;
  Display *dpy;
  XWindowChanges changes;
  uint mask;
  int height_local;
  int width_local;
  XlibWindow *this_local;
  
  changes._36_4_ = 0xc;
  pDVar1 = XlibDisplay::getXDisplay(this->m_display);
  changes.x = width;
  changes.y = height;
  XConfigureWindow(pDVar1,this->m_window,0xc,&dpy);
  XFlush(pDVar1);
  do {
    while (XNextEvent(pDVar1,&e.override_redirect), e.override_redirect != 0x16) {
      XlibDisplay::processEvent(this->m_display,(XEvent *)&e.override_redirect);
    }
    memcpy(local_168,&e.override_redirect,0x58);
  } while ((e.x != width) || (e.y != height));
  return;
}

Assistant:

void XlibWindow::setDimensions (int width, int height)
{
	const unsigned int	mask		= CWWidth | CWHeight;
	XWindowChanges		changes;
	::Display*			dpy			= m_display.getXDisplay();
	XEvent				myevent;
	changes.width	= width;
	changes.height	= height;
	XConfigureWindow(dpy, m_window, mask, &changes);
	XFlush(dpy);

	for(;;)
	{
		XNextEvent(dpy, &myevent);
		if (myevent.type == ConfigureNotify) {
			XConfigureEvent e = myevent.xconfigure;
			if (e.width == width && e.height == height)
				break;
		}
		else
			m_display.processEvent(myevent);
	}
}